

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Entity_Damage_Status_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  StandardVariable *pSVar3;
  string local_240 [32];
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_220;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Entity_Damage_Status_PDU *local_18;
  Entity_Damage_Status_PDU *this_local;
  
  local_18 = this;
  this_local = (Entity_Damage_Status_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Entity Damage Status PDU-\n");
  poVar2 = std::operator<<(poVar2,"Damaged Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_((KString *)&citr,&this->m_DmgEnt);
  UTILS::IndentString(&local_1f0,(KString *)&citr,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Number Of DD Records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumDmgDescRecs);
  std::operator<<(poVar2,"\nDE Records:\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&this->m_vDdRec);
  local_220._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&this->m_vDdRec);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_220);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_00);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_240);
    std::operator<<(local_190,local_240);
    std::__cxx11::string::~string(local_240);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Entity_Damage_Status_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Entity Damage Status PDU-\n"
       << "Damaged Entity ID:\n"
       << IndentString( m_DmgEnt.GetAsString(), 1 )
       << "Number Of DD Records: " << m_ui16NumDmgDescRecs
       << "\nDE Records:\n";

    vector<StdVarPtr>::const_iterator citr = m_vDdRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vDdRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}